

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelfSelectClient.cpp
# Opt level: O3

ssize_t __thiscall
xmrig::SelfSelectClient::send(SelfSelectClient *this,int __fd,void *__buf,size_t __n,int __flags)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  HttpsClient *this_00;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  socklen_t __len;
  IHttpListener *pIVar3;
  undefined4 in_register_00000084;
  String local_58;
  String local_48;
  
  iVar1 = (*(this->super_IClient)._vptr_IClient[10])();
  if (*(char *)(CONCAT44(extraout_var,iVar1) + 0x58) == '\x01') {
    this_00 = (HttpsClient *)operator_new(0x988);
    String::String(&local_58,(char *)__buf);
    pIVar3 = &this->super_IHttpListener;
    local_48.m_data = (char *)0x0;
    local_48.m_size = 0;
    HttpsClient::HttpsClient
              (this_00,__fd,&local_58,pIVar3,(char *)__n,CONCAT44(in_register_00000084,__flags),
               &local_48);
    __len = (socklen_t)pIVar3;
    if (local_48.m_data != (char *)0x0) {
      operator_delete__(local_48.m_data);
    }
  }
  else {
    this_00 = (HttpsClient *)operator_new(0x108);
    String::String(&local_58,(char *)__buf);
    pIVar3 = &this->super_IHttpListener;
    HttpClient::HttpClient
              ((HttpClient *)this_00,__fd,&local_58,pIVar3,(char *)__n,
               CONCAT44(in_register_00000084,__flags));
    __len = (socklen_t)pIVar3;
  }
  if (local_58.m_data != (char *)0x0) {
    operator_delete__(local_58.m_data);
  }
  (this_00->super_HttpClient).m_quiet =
       (bool)((long)this->m_retries <= this->m_failures | this->m_quiet);
  iVar1 = (*(this->super_IClient)._vptr_IClient[10])(this);
  iVar2 = (*(this->super_IClient)._vptr_IClient[10])(this);
  iVar1 = HttpClient::connect(&this_00->super_HttpClient,iVar1 + 0x60,
                              (sockaddr *)(ulong)*(ushort *)(CONCAT44(extraout_var_00,iVar2) + 0x80)
                              ,__len);
  return CONCAT44(extraout_var_01,iVar1);
}

Assistant:

void xmrig::SelfSelectClient::send(int method, const char *url, const char *data, size_t size)
{
    LOG_DEBUG("[%s] " MAGENTA_BOLD("\"%s %s\"") BLACK_BOLD_S " send (%zu bytes): \"%.*s\"",
              pool().daemon().url().data(),
              http_method_str(static_cast<http_method>(method)),
              url,
              size,
              static_cast<int>(size),
              data);

    HttpClient *client;
#   ifdef XMRIG_FEATURE_TLS
    if (pool().daemon().isTLS()) {
        client = new HttpsClient(method, url, this, data, size, String());
    }
    else
#   endif
    {
        client = new HttpClient(method, url, this, data, size);
    }

    client->setQuiet(isQuiet());
    client->connect(pool().daemon().host(), pool().daemon().port());
}